

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O1

bool testing::Mock::VerifyAndClearExpectationsLocked(void *mock_obj)

{
  bool bVar1;
  mapped_type *pmVar2;
  _Base_ptr p_Var3;
  long lVar4;
  long lVar5;
  key_type *in_RSI;
  ulong in_RDI;
  _Rb_tree_header *p_Var6;
  bool bVar7;
  
  internal::MutexBase::AssertHeld((MutexBase *)internal::g_gmock_mutex);
  lVar4 = 0x1626c8;
  if ((anonymous_namespace)::g_mock_object_registry._16_8_ != 0) {
    lVar4 = 0x1626c8;
    lVar5 = (anonymous_namespace)::g_mock_object_registry._16_8_;
    do {
      bVar7 = *(ulong *)(lVar5 + 0x20) < in_RDI;
      in_RSI = (key_type *)(ulong)bVar7;
      if (!bVar7) {
        lVar4 = lVar5;
      }
      lVar5 = *(long *)(lVar5 + 0x10 + (long)in_RSI * 8);
    } while (lVar5 != 0);
  }
  bVar7 = true;
  if ((lVar4 != 0x1626c8) && (*(ulong *)(lVar4 + 0x20) <= in_RDI)) {
    pmVar2 = std::
             map<const_void_*,_testing::(anonymous_namespace)::MockObjectState,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>_>
             ::operator[]((map<const_void_*,_testing::(anonymous_namespace)::MockObjectState,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>_>
                           *)&stack0xffffffffffffffd8,in_RSI);
    p_Var3 = (pmVar2->function_mockers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var6 = &(pmVar2->function_mockers)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var3 != p_Var6) {
      bVar7 = true;
      do {
        bVar1 = internal::UntypedFunctionMockerBase::VerifyAndClearExpectationsLocked
                          (*(UntypedFunctionMockerBase **)(p_Var3 + 1));
        if (!bVar1) {
          bVar7 = false;
        }
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
      } while ((_Rb_tree_header *)p_Var3 != p_Var6);
    }
  }
  return bVar7;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(internal::g_gmock_mutex) {
  internal::g_gmock_mutex.AssertHeld();
  if (g_mock_object_registry.states().count(mock_obj) == 0) {
    // No EXPECT_CALL() was set on the given mock object.
    return true;
  }

  // Verifies and clears the expectations on each mock method in the
  // given mock object.
  bool expectations_met = true;
  FunctionMockers& mockers =
      g_mock_object_registry.states()[mock_obj].function_mockers;
  for (FunctionMockers::const_iterator it = mockers.begin();
       it != mockers.end(); ++it) {
    if (!(*it)->VerifyAndClearExpectationsLocked()) {
      expectations_met = false;
    }
  }

  // We don't clear the content of mockers, as they may still be
  // needed by ClearDefaultActionsLocked().
  return expectations_met;
}